

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_formatter.h
# Opt level: O0

void ST::apply_format<char_const(&)[5]>(format_writer *data,char (*arg0) [5])

{
  bool bVar1;
  out_of_range *this;
  char *in_RDX;
  function<void_(const_ST::format_spec_&,_ST::format_writer_&)> *local_90;
  long local_80;
  size_t formatter_id;
  format_spec spec;
  long local_40;
  size_t index;
  formatter_ref_t formatters [1];
  char (*arg0_local) [5];
  format_writer *data_local;
  
  formatters[0]._M_invoker = (_Invoker_type)arg0;
  make_formatter_ref<char_const*>((formatter_ref_t *)&index,(ST *)arg0,in_RDX);
  local_40 = 0;
  while( true ) {
    bVar1 = format_writer::next_format(data);
    if (!bVar1) {
      local_90 = (function<void_(const_ST::format_spec_&,_ST::format_writer_&)> *)
                 &formatters[0]._M_invoker;
      do {
        local_90 = local_90 + -1;
        std::function<void_(const_ST::format_spec_&,_ST::format_writer_&)>::~function(local_90);
      } while (local_90 != (function<void_(const_ST::format_spec_&,_ST::format_writer_&)> *)&index);
      return;
    }
    format_writer::parse_format((format_spec *)&formatter_id,data);
    if (spec.minimum_length < 0) {
      local_80 = local_40;
      local_40 = local_40 + 1;
    }
    else {
      local_80 = (long)(spec.minimum_length + -1);
    }
    if (local_80 != 0) break;
    std::function<void_(const_ST::format_spec_&,_ST::format_writer_&)>::operator()
              ((function<void_(const_ST::format_spec_&,_ST::format_writer_&)> *)&index,
               (format_spec *)&formatter_id,data);
  }
  this = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this,"Parameter index out of range");
  __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void apply_format(ST::format_writer &data, arg0_T &&arg0, args_T &&...args)
    {
        enum { num_formatters = 1 + sizeof...(args) };
        formatter_ref_t formatters[num_formatters] = {
            make_formatter_ref(std::forward<arg0_T>(arg0)),
            make_formatter_ref(std::forward<args_T>(args))...
        };
        size_t index = 0;
        while (data.next_format()) {
            ST::format_spec spec = data.parse_format();
            size_t formatter_id = (spec.arg_index >= 0)
                                  ? spec.arg_index - 1
                                  : index++;
            if (formatter_id >= num_formatters)
                throw std::out_of_range("Parameter index out of range");
            formatters[formatter_id](spec, data);
        }
    }